

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv4.c
# Opt level: O2

int lrtr_ipv4_addr_to_str(lrtr_ipv4_addr *ip,char *str,uint len)

{
  uint uVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  uVar1 = ip->addr;
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    iVar2 = snprintf(str,len,"%hhu.%hhu.%hhu.%hhu",uVar1 >> 0x18,(ulong)(uVar1 >> 0x10 & 0xff),
                     (ulong)(uVar1 >> 8 & 0xff),uVar1 & 0xff);
    return iVar2 >> 0x1f;
  }
  __stack_chk_fail();
}

Assistant:

int lrtr_ipv4_addr_to_str(const struct lrtr_ipv4_addr *ip, char *str, unsigned int len)
{
	uint8_t buff[4];

	buff[0] = ip->addr >> 24 & 0xff;
	buff[1] = ip->addr >> 16 & 0xff;
	buff[2] = ip->addr >> 8 & 0xff;
	buff[3] = ip->addr & 0xff;

	if (snprintf(str, len, "%hhu.%hhu.%hhu.%hhu", buff[0], buff[1], buff[2], buff[3]) < 0)
		return -1;

	return 0;
}